

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HMAC.c
# Opt level: O1

void EverCrypt_HMAC_compute_sha2_512
               (uint8_t *dst,uint8_t *key,uint32_t key_len,uint8_t *data,uint32_t data_len)

{
  byte *pbVar1;
  uint uVar2;
  undefined1 totlen [16];
  undefined1 totlen_00 [16];
  uint32_t i;
  long lVar3;
  uint uVar4;
  uint32_t len;
  uint64_t *hash;
  undefined8 uVar5;
  undefined8 uVar6;
  byte local_188 [128];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint8_t *local_88;
  uint8_t *local_80;
  uint64_t uStack_78;
  uint64_t st [8];
  
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  if (key_len < 0x81) {
    local_188[0x78] = 0x42;
    local_188[0x79] = 0x95;
    local_188[0x7a] = 0x17;
    local_188[0x7b] = 0;
    local_188[0x7c] = 0;
    local_188[0x7d] = 0;
    local_188[0x7e] = 0;
    local_188[0x7f] = 0;
    memcpy(&local_108,key,(ulong)key_len);
  }
  else {
    local_188[0x78] = 0x50;
    local_188[0x79] = 0x95;
    local_188[0x7a] = 0x17;
    local_188[0x7b] = 0;
    local_188[0x7c] = 0;
    local_188[0x7d] = 0;
    local_188[0x7e] = 0;
    local_188[0x7f] = 0;
    Hacl_Hash_SHA2_hash_512((uint8_t *)&local_108,key,key_len);
  }
  local_188[0x70] = 0x36;
  local_188[0x71] = 0x36;
  local_188[0x72] = 0x36;
  local_188[0x73] = 0x36;
  local_188[0x74] = 0x36;
  local_188[0x75] = 0x36;
  local_188[0x76] = 0x36;
  local_188[0x77] = 0x36;
  local_188[0x78] = 0x36;
  local_188[0x79] = 0x36;
  local_188[0x7a] = 0x36;
  local_188[0x7b] = 0x36;
  local_188[0x7c] = 0x36;
  local_188[0x7d] = 0x36;
  local_188[0x7e] = 0x36;
  local_188[0x7f] = 0x36;
  local_188[0x60] = 0x36;
  local_188[0x61] = 0x36;
  local_188[0x62] = 0x36;
  local_188[99] = 0x36;
  local_188[100] = 0x36;
  local_188[0x65] = 0x36;
  local_188[0x66] = 0x36;
  local_188[0x67] = 0x36;
  local_188[0x68] = 0x36;
  local_188[0x69] = 0x36;
  local_188[0x6a] = 0x36;
  local_188[0x6b] = 0x36;
  local_188[0x6c] = 0x36;
  local_188[0x6d] = 0x36;
  local_188[0x6e] = 0x36;
  local_188[0x6f] = 0x36;
  local_188[0x50] = 0x36;
  local_188[0x51] = 0x36;
  local_188[0x52] = 0x36;
  local_188[0x53] = 0x36;
  local_188[0x54] = 0x36;
  local_188[0x55] = 0x36;
  local_188[0x56] = 0x36;
  local_188[0x57] = 0x36;
  local_188[0x58] = 0x36;
  local_188[0x59] = 0x36;
  local_188[0x5a] = 0x36;
  local_188[0x5b] = 0x36;
  local_188[0x5c] = 0x36;
  local_188[0x5d] = 0x36;
  local_188[0x5e] = 0x36;
  local_188[0x5f] = 0x36;
  local_188[0x40] = 0x36;
  local_188[0x41] = 0x36;
  local_188[0x42] = 0x36;
  local_188[0x43] = 0x36;
  local_188[0x44] = 0x36;
  local_188[0x45] = 0x36;
  local_188[0x46] = 0x36;
  local_188[0x47] = 0x36;
  local_188[0x48] = 0x36;
  local_188[0x49] = 0x36;
  local_188[0x4a] = 0x36;
  local_188[0x4b] = 0x36;
  local_188[0x4c] = 0x36;
  local_188[0x4d] = 0x36;
  local_188[0x4e] = 0x36;
  local_188[0x4f] = 0x36;
  local_188[0x30] = 0x36;
  local_188[0x31] = 0x36;
  local_188[0x32] = 0x36;
  local_188[0x33] = 0x36;
  local_188[0x34] = 0x36;
  local_188[0x35] = 0x36;
  local_188[0x36] = 0x36;
  local_188[0x37] = 0x36;
  local_188[0x38] = 0x36;
  local_188[0x39] = 0x36;
  local_188[0x3a] = 0x36;
  local_188[0x3b] = 0x36;
  local_188[0x3c] = 0x36;
  local_188[0x3d] = 0x36;
  local_188[0x3e] = 0x36;
  local_188[0x3f] = 0x36;
  local_188[0x20] = 0x36;
  local_188[0x21] = 0x36;
  local_188[0x22] = 0x36;
  local_188[0x23] = 0x36;
  local_188[0x24] = 0x36;
  local_188[0x25] = 0x36;
  local_188[0x26] = 0x36;
  local_188[0x27] = 0x36;
  local_188[0x28] = 0x36;
  local_188[0x29] = 0x36;
  local_188[0x2a] = 0x36;
  local_188[0x2b] = 0x36;
  local_188[0x2c] = 0x36;
  local_188[0x2d] = 0x36;
  local_188[0x2e] = 0x36;
  local_188[0x2f] = 0x36;
  local_188[0x10] = 0x36;
  local_188[0x11] = 0x36;
  local_188[0x12] = 0x36;
  local_188[0x13] = 0x36;
  local_188[0x14] = 0x36;
  local_188[0x15] = 0x36;
  local_188[0x16] = 0x36;
  local_188[0x17] = 0x36;
  local_188[0x18] = 0x36;
  local_188[0x19] = 0x36;
  local_188[0x1a] = 0x36;
  local_188[0x1b] = 0x36;
  local_188[0x1c] = 0x36;
  local_188[0x1d] = 0x36;
  local_188[0x1e] = 0x36;
  local_188[0x1f] = 0x36;
  local_188[0] = 0x36;
  local_188[1] = 0x36;
  local_188[2] = 0x36;
  local_188[3] = 0x36;
  local_188[4] = 0x36;
  local_188[5] = 0x36;
  local_188[6] = 0x36;
  local_188[7] = 0x36;
  local_188[8] = 0x36;
  local_188[9] = 0x36;
  local_188[10] = 0x36;
  local_188[0xb] = 0x36;
  local_188[0xc] = 0x36;
  local_188[0xd] = 0x36;
  local_188[0xe] = 0x36;
  local_188[0xf] = 0x36;
  lVar3 = 0;
  do {
    pbVar1 = local_188 + lVar3;
    *pbVar1 = *pbVar1 ^ *(byte *)((long)&local_108 + lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  uVar5 = 0x5c5c5c5c5c5c5c5c;
  uVar6 = 0x5c5c5c5c5c5c5c5c;
  lVar3 = 0;
  do {
    pbVar1 = &stack0xfffffffffffffdf8 + lVar3;
    *pbVar1 = *pbVar1 ^ *(byte *)((long)&local_108 + lVar3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  uStack_78 = 0x6a09e667f3bcc908;
  st[0] = 0xbb67ae8584caa73b;
  st[1] = 0x3c6ef372fe94f82b;
  st[2] = 0xa54ff53a5f1d36f1;
  st[3] = 0x510e527fade682d1;
  st[4] = 0x9b05688c2b3e6c1f;
  st[5] = 0x1f83d9abfb41bd6b;
  st[6] = 0x5be0cd19137e2179;
  if (data_len == 0) {
    len = 0x80;
    hash = (uint64_t *)0x80;
  }
  else {
    uVar4 = (data_len >> 7) - 1;
    uVar2 = data_len + uVar4 * -0x80;
    if (data_len < 0x80 || (data_len & 0x7f) != 0) {
      uVar2 = data_len & 0x7f;
      uVar4 = data_len >> 7;
    }
    hash = (uint64_t *)(ulong)uVar2;
    uVar4 = uVar4 * 0x80;
    local_80 = data + uVar4;
    local_88 = dst;
    Hacl_Hash_SHA2_sha512_update_nblocks(0x80,local_188,&uStack_78);
    Hacl_Hash_SHA2_sha512_update_nblocks(uVar4,data,&uStack_78);
    len = uVar4 + uVar2 + 0x80;
    dst = local_88;
  }
  totlen._8_8_ = uVar6;
  totlen._0_8_ = uVar5;
  Hacl_Hash_SHA2_sha512_update_last((FStar_UInt128_uint128)totlen,len,(uint8_t *)0x0,hash);
  Hacl_Hash_SHA2_sha512_finish(&uStack_78,local_188);
  Hacl_Hash_SHA2_sha512_init(&uStack_78);
  Hacl_Hash_SHA2_sha512_update_nblocks(0x80,&stack0xfffffffffffffdf8,&uStack_78);
  Hacl_Hash_SHA2_sha512_update_nblocks(0,local_188,&uStack_78);
  totlen_00._8_8_ = uVar6;
  totlen_00._0_8_ = uVar5;
  Hacl_Hash_SHA2_sha512_update_last
            ((FStar_UInt128_uint128)totlen_00,0xc0,(uint8_t *)0x0,(uint64_t *)0x40);
  Hacl_Hash_SHA2_sha512_finish(&uStack_78,dst);
  return;
}

Assistant:

void
EverCrypt_HMAC_compute_sha2_512(
  uint8_t *dst,
  uint8_t *key,
  uint32_t key_len,
  uint8_t *data,
  uint32_t data_len
)
{
  uint32_t l = 128U;
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t key_block[l];
  memset(key_block, 0U, l * sizeof (uint8_t));
  uint8_t *nkey = key_block;
  uint32_t ite;
  if (key_len <= 128U)
  {
    ite = key_len;
  }
  else
  {
    ite = 64U;
  }
  uint8_t *zeroes = key_block + ite;
  KRML_MAYBE_UNUSED_VAR(zeroes);
  if (key_len <= 128U)
  {
    memcpy(nkey, key, key_len * sizeof (uint8_t));
  }
  else
  {
    Hacl_Hash_SHA2_hash_512(nkey, key, key_len);
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t ipad[l];
  memset(ipad, 0x36U, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = ipad[i];
    uint8_t yi = key_block[i];
    ipad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), l);
  uint8_t opad[l];
  memset(opad, 0x5cU, l * sizeof (uint8_t));
  for (uint32_t i = 0U; i < l; i++)
  {
    uint8_t xi = opad[i];
    uint8_t yi = key_block[i];
    opad[i] = (uint32_t)xi ^ (uint32_t)yi;
  }
  uint64_t st[8U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t *os = st;
    uint64_t x = Hacl_Hash_SHA2_h512[i];
    os[i] = x;);
  uint64_t *s = st;
  uint8_t *dst1 = ipad;
  if (data_len == 0U)
  {
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128(0ULL),
        FStar_UInt128_uint64_to_uint128((uint64_t)128U)),
      128U,
      ipad,
      s);
  }
  else
  {
    uint32_t block_len = 128U;
    uint32_t n_blocks0 = data_len / block_len;
    uint32_t rem0 = data_len % block_len;
    K___uint32_t_uint32_t scrut;
    if (n_blocks0 > 0U && rem0 == 0U)
    {
      uint32_t n_blocks_ = n_blocks0 - 1U;
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = data_len - n_blocks_ * block_len });
    }
    else
    {
      scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
    }
    uint32_t n_blocks = scrut.fst;
    uint32_t rem_len = scrut.snd;
    uint32_t full_blocks_len = n_blocks * block_len;
    uint8_t *full_blocks = data;
    uint8_t *rem = data + full_blocks_len;
    Hacl_Hash_SHA2_sha512_update_nblocks(128U, ipad, s);
    Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
    Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
          FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
        FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
      rem_len,
      rem,
      s);
  }
  Hacl_Hash_SHA2_sha512_finish(s, dst1);
  uint8_t *hash1 = ipad;
  Hacl_Hash_SHA2_sha512_init(s);
  uint32_t block_len = 128U;
  uint32_t n_blocks0 = 64U / block_len;
  uint32_t rem0 = 64U % block_len;
  K___uint32_t_uint32_t scrut;
  if (n_blocks0 > 0U && rem0 == 0U)
  {
    uint32_t n_blocks_ = n_blocks0 - 1U;
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks_, .snd = 64U - n_blocks_ * block_len });
  }
  else
  {
    scrut = ((K___uint32_t_uint32_t){ .fst = n_blocks0, .snd = rem0 });
  }
  uint32_t n_blocks = scrut.fst;
  uint32_t rem_len = scrut.snd;
  uint32_t full_blocks_len = n_blocks * block_len;
  uint8_t *full_blocks = hash1;
  uint8_t *rem = hash1 + full_blocks_len;
  Hacl_Hash_SHA2_sha512_update_nblocks(128U, opad, s);
  Hacl_Hash_SHA2_sha512_update_nblocks(n_blocks * 128U, full_blocks, s);
  Hacl_Hash_SHA2_sha512_update_last(FStar_UInt128_add(FStar_UInt128_add(FStar_UInt128_uint64_to_uint128((uint64_t)128U),
        FStar_UInt128_uint64_to_uint128((uint64_t)full_blocks_len)),
      FStar_UInt128_uint64_to_uint128((uint64_t)rem_len)),
    rem_len,
    rem,
    s);
  Hacl_Hash_SHA2_sha512_finish(s, dst);
}